

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O2

char * fai_fetch(faidx_t *fai,char *str,int *len)

{
  char cVar1;
  khint_t kVar2;
  int iVar3;
  kh_s_t *h;
  faidx1_t *pfVar4;
  uint64_t uVar5;
  uint uVar6;
  uint uVar7;
  khint_t kVar8;
  khint_t kVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  size_t sVar14;
  kh_cstr_t key;
  ushort **ppuVar15;
  long lVar16;
  char *pcVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  
  h = fai->hash;
  sVar14 = strlen(str);
  uVar7 = (uint)sVar14;
  key = (kh_cstr_t)malloc((long)(int)(uVar7 + 1));
  uVar26 = 0;
  uVar20 = 0;
  if (0 < (int)uVar7) {
    uVar20 = sVar14 & 0xffffffff;
  }
  uVar23 = 0;
  for (; lVar18 = (long)(int)uVar23, uVar20 != uVar26; uVar26 = uVar26 + 1) {
    ppuVar15 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar15 + (long)str[uVar26] * 2 + 1) & 0x20) == 0) {
      uVar23 = uVar23 + 1;
      key[lVar18] = str[uVar26];
    }
  }
  key[lVar18] = '\0';
  uVar20 = (ulong)uVar23;
  uVar6 = uVar23;
  do {
    uVar20 = uVar20 - 1;
    uVar19 = uVar7;
    if ((int)uVar6 < 1) break;
    uVar19 = uVar6 - 1;
    uVar6 = uVar19;
  } while (key[uVar20 & 0xffffffff] != ':');
  if ((int)uVar19 < (int)uVar23) {
    lVar27 = (long)(int)uVar19;
    uVar7 = 0;
    do {
      lVar22 = lVar27 + 1;
LAB_001355b9:
      lVar27 = lVar22;
      if (lVar18 <= lVar27) goto LAB_0013560a;
      cVar1 = key[lVar27];
      if ((long)cVar1 != 0x2d) goto code_r0x001355cc;
      uVar7 = uVar7 + 1;
    } while( true );
  }
  kVar9 = kh_get_s(h,str);
  kVar2 = h->n_buckets;
LAB_0013566e:
  if (kVar9 == kVar2) {
    pcVar17 = (char *)0x0;
    fprintf(_stderr,
            "[fai_fetch] Warning - Reference %s not found in FASTA file, returning empty sequence\n"
            ,str);
    free(key);
    *len = -2;
  }
  else {
    pfVar4 = h->vals;
    iVar13 = pfVar4[kVar9].line_len;
    iVar3 = pfVar4[kVar9].line_blen;
    lVar27 = pfVar4[kVar9].len;
    uVar5 = pfVar4[kVar9].offset;
    iVar10 = (int)lVar27;
    iVar12 = iVar10;
    if ((int)uVar19 < (int)uVar23) {
      lVar22 = 1;
      iVar25 = uVar19 + 1;
      lVar21 = (long)(int)uVar19;
      lVar16 = lVar21;
      while( true ) {
        lVar16 = lVar16 + 1;
        lVar24 = (long)iVar25;
        if (lVar18 <= lVar16) break;
        if (key[lVar16] != ',') {
          iVar25 = iVar25 + 1;
          key[lVar24] = key[lVar16];
        }
      }
      key[lVar24] = '\0';
      iVar11 = atoi(key + lVar21 + 1);
      lVar18 = lVar21 << 0x20;
      for (; lVar18 = lVar18 + 0x100000000, lVar24 - lVar21 != lVar22; lVar22 = lVar22 + 1) {
        if (key[lVar22 + lVar21] == '-') {
          if ((int)(uVar19 + (int)lVar22) < iVar25) {
            iVar12 = atoi(key + (lVar18 >> 0x20) + 1);
          }
          break;
        }
      }
      iVar11 = iVar11 - (uint)(0 < iVar11);
    }
    else {
      iVar11 = 0;
    }
    if (lVar27 <= iVar11) {
      iVar11 = iVar10;
    }
    if (lVar27 <= iVar12) {
      iVar12 = iVar10;
    }
    if (iVar12 <= iVar11) {
      iVar11 = iVar12;
    }
    free(key);
    iVar13 = bgzf_useek(fai->bgzf,
                        uVar5 + (long)(iVar11 % iVar3) + (long)(iVar11 / iVar3) * (long)iVar13,0);
    if (iVar13 < 0) {
      *len = -1;
      fwrite("[fai_fetch] Error: fai_fetch failed. (Seeking in a compressed, .gzi unindexed, file?)\n"
             ,0x56,1,_stderr);
LAB_00135886:
      pcVar17 = (char *)0x0;
    }
    else {
      pcVar17 = (char *)malloc((long)((iVar12 - iVar11) + 2));
      uVar7 = 0;
      while( true ) {
        uVar23 = bgzf_getc(fai->bgzf);
        if (((int)uVar23 < 0) || (iVar12 - iVar11 <= (int)uVar7)) break;
        ppuVar15 = __ctype_b_loc();
        if ((short)(*ppuVar15)[uVar23] < 0) {
          pcVar17[uVar7] = (char)uVar23;
          uVar7 = uVar7 + 1;
        }
      }
      pcVar17[uVar7] = '\0';
      *len = uVar7;
    }
  }
  return pcVar17;
code_r0x001355cc:
  ppuVar15 = __ctype_b_loc();
  lVar22 = lVar27 + 1;
  if ((cVar1 != ',') && (((*ppuVar15)[cVar1] & 0x800) == 0)) {
LAB_0013560a:
    if (1 < uVar7) {
      uVar19 = uVar23;
    }
    if (lVar27 < lVar18) {
      uVar19 = uVar23;
    }
    key[(int)uVar19] = '\0';
    kVar8 = kh_get_s(h,key);
    kVar2 = h->n_buckets;
    kVar9 = kVar8;
    if (kVar8 != kVar2) goto LAB_0013566e;
    kVar9 = kh_get_s(h,str);
    if (kVar9 != kVar8) {
      key[(int)uVar19] = ':';
      uVar19 = uVar23;
      kVar2 = kVar8;
      goto LAB_0013566e;
    }
    *len = 0;
    free(key);
    goto LAB_00135886;
  }
  goto LAB_001355b9;
}

Assistant:

char *fai_fetch(const faidx_t *fai, const char *str, int *len)
{
    char *s;
    int c, i, l, k, name_end;
    khiter_t iter;
    faidx1_t val;
    khash_t(s) *h;
    int beg, end;

    beg = end = -1;
    h = fai->hash;
    name_end = l = strlen(str);
    s = (char*)malloc(l+1);
    // remove space
    for (i = k = 0; i < l; ++i)
        if (!isspace(str[i])) s[k++] = str[i];
    s[k] = 0; l = k;
    // determine the sequence name
    for (i = l - 1; i >= 0; --i) if (s[i] == ':') break; // look for colon from the end
    if (i >= 0) name_end = i;
    if (name_end < l) { // check if this is really the end
        int n_hyphen = 0;
        for (i = name_end + 1; i < l; ++i) {
            if (s[i] == '-') ++n_hyphen;
            else if (!isdigit(s[i]) && s[i] != ',') break;
        }
        if (i < l || n_hyphen > 1) name_end = l; // malformated region string; then take str as the name
        s[name_end] = 0;
        iter = kh_get(s, h, s);
        if (iter == kh_end(h)) { // cannot find the sequence name
            iter = kh_get(s, h, str); // try str as the name
            if (iter == kh_end(h)) {
                *len = 0;
            free(s); return 0;
            } else s[name_end] = ':', name_end = l;
        }
    } else iter = kh_get(s, h, str);
    if(iter == kh_end(h)) {
        fprintf(stderr, "[fai_fetch] Warning - Reference %s not found in FASTA file, returning empty sequence\n", str);
        free(s);
        *len = -2;
        return 0;
    };
    val = kh_value(h, iter);
    // parse the interval
    if (name_end < l) {
        for (i = k = name_end + 1; i < l; ++i)
            if (s[i] != ',') s[k++] = s[i];
        s[k] = 0;
        beg = atoi(s + name_end + 1);
        for (i = name_end + 1; i != k; ++i) if (s[i] == '-') break;
        end = i < k? atoi(s + i + 1) : val.len;
        if (beg > 0) --beg;
    } else beg = 0, end = val.len;
    if (beg >= val.len) beg = val.len;
    if (end >= val.len) end = val.len;
    if (beg > end) beg = end;
    free(s);

    // now retrieve the sequence
    int ret = bgzf_useek(fai->bgzf, val.offset + beg / val.line_blen * val.line_len + beg % val.line_blen, SEEK_SET);
    if ( ret<0 )
    {
        *len = -1;
        fprintf(stderr, "[fai_fetch] Error: fai_fetch failed. (Seeking in a compressed, .gzi unindexed, file?)\n");
        return NULL;
    }
    l = 0;
    s = (char*)malloc(end - beg + 2);
    while ( (c=bgzf_getc(fai->bgzf))>=0 && l < end - beg )
        if (isgraph(c)) s[l++] = c;
    s[l] = '\0';
    *len = l;
    return s;
}